

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dnsprobe *datap;
  dynbuf *s;
  byte bVar1;
  int iVar2;
  dohdata *pdVar3;
  sockaddr *psVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort rdlength;
  DOHcode DVar7;
  uchar *puVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  Curl_addrinfo *pCVar12;
  Curl_dns_entry *pCVar13;
  sa_family_t sVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  dohentry *pdVar18;
  ushort type;
  CURLcode CVar19;
  long lVar20;
  DOHcode *pDVar21;
  anon_union_16_2_f9ece763_for_ip *paVar22;
  uint uVar23;
  long lVar24;
  size_t sVar25;
  bool bVar26;
  int iVar27;
  ulong uVar28;
  Curl_addrinfo *pCVar29;
  bool bVar30;
  dohentry de;
  Curl_addrinfo *local_370;
  DOHcode local_348;
  DOHcode local_344;
  dohdata *local_340;
  Curl_easy *local_338;
  Curl_dns_entry **local_330;
  uint local_328 [2];
  char local_31e [126];
  dohentry local_2a0;
  
  pdVar3 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar3 == (dohdata *)0x0) {
    CVar19 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar3->probe[0].easy == (CURL *)0x0) && (pdVar3->probe[1].easy == (CURL *)0x0)) {
    Curl_failf(data,"Could not DOH-resolve: %s",(data->state).async.hostname);
    CVar19 = (((data->conn->bits).field_0x5 & 4) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar19 = CURLE_OK;
    if (pdVar3->pending == 0) {
      datap = pdVar3->probe;
      lVar24 = 0;
      local_348 = DOH_OK;
      local_344 = DOH_OK;
      local_330 = dnsp;
      curl_multi_remove_handle(data->multi,pdVar3->probe[0].easy);
      Curl_close(&datap->easy);
      local_340 = pdVar3;
      curl_multi_remove_handle(data->multi,pdVar3->probe[1].easy);
      Curl_close(&pdVar3->probe[1].easy);
      memset(&local_2a0,0,0x270);
      local_2a0.ttl = 0x7fffffff;
      do {
        Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar24),0x100);
        lVar24 = lVar24 + 0x20;
      } while (lVar24 != 0x80);
      pDVar21 = &local_348;
      lVar24 = 0;
      bVar26 = true;
      local_338 = data;
LAB_00115bfa:
      if (pdVar3->probe[lVar24].dnstype != 0) {
        s = &datap[lVar24].serverdoh;
        puVar8 = Curl_dyn_uptr(s);
        sVar9 = Curl_dyn_len(s);
        DVar7 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < sVar9) && (DVar7 = DOH_DNS_BAD_ID, puVar8 != (uchar *)0x0)) &&
            (*puVar8 == '\0')) &&
           ((puVar8[1] == '\0' && (DVar7 = DOH_DNS_BAD_RCODE, (puVar8[3] & 0xf) == 0)))) {
          uVar15 = datap[lVar24].dnstype;
          sVar25 = 0xc;
          for (uVar6 = *(ushort *)(puVar8 + 4) << 8 | *(ushort *)(puVar8 + 4) >> 8; uVar6 != 0;
              uVar6 = uVar6 - 1) {
            do {
              uVar23 = (int)sVar25 + 1;
              if (sVar9 < uVar23) goto LAB_00115f8c;
              bVar1 = puVar8[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar7 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00115f91;
                uVar23 = (int)sVar25 + 2;
                if (sVar9 < uVar23) goto LAB_00115f8c;
                break;
              }
              uVar23 = uVar23 + bVar1;
              sVar25 = (size_t)uVar23;
              if (sVar9 < sVar25) goto LAB_00115f8c;
            } while (bVar1 != 0);
            sVar25 = (size_t)(uVar23 + 4);
            DVar7 = DOH_DNS_OUT_OF_RANGE;
            if (sVar9 < sVar25) goto LAB_00115f91;
          }
          uVar6 = *(ushort *)(puVar8 + 6) << 8 | *(ushort *)(puVar8 + 6) >> 8;
          if (uVar6 == 0) {
            bVar30 = true;
          }
          else {
LAB_00115d09:
            do {
              uVar23 = (int)sVar25 + 1;
              if (sVar9 < uVar23) goto LAB_00115f8c;
              bVar1 = puVar8[sVar25];
              if ((bVar1 & 0xc0) == 0) {
                uVar23 = uVar23 + bVar1;
                if (sVar9 < uVar23) goto LAB_00115f8c;
                sVar25 = (size_t)uVar23;
                if (bVar1 != 0) goto LAB_00115d09;
              }
              else {
                DVar7 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00115f91;
                uVar23 = (int)sVar25 + 2;
                if (sVar9 < uVar23) goto LAB_00115f8c;
              }
              if (sVar9 < uVar23 + 2) goto LAB_00115f8c;
              type = *(ushort *)(puVar8 + (int)uVar23) << 8 | *(ushort *)(puVar8 + (int)uVar23) >> 8
              ;
              if (((type != 5) && (type != 0x27)) && (uVar15 != type)) {
                DVar7 = DOH_DNS_UNEXPECTED_TYPE;
                goto LAB_00115f91;
              }
              if (sVar9 < uVar23 + 4) goto LAB_00115f8c;
              if ((ushort)(*(ushort *)(puVar8 + (int)(uVar23 + 2)) << 8 |
                          *(ushort *)(puVar8 + (int)(uVar23 + 2)) >> 8) != 1) {
                DVar7 = DOH_DNS_UNEXPECTED_CLASS;
                goto LAB_00115f91;
              }
              if (sVar9 < uVar23 + 8) goto LAB_00115f8c;
              uVar17 = *(uint *)(puVar8 + (int)(uVar23 + 4));
              uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
              if (uVar17 < local_2a0.ttl) {
                local_2a0.ttl = uVar17;
              }
              uVar17 = uVar23 + 10;
              if (sVar9 < uVar17) goto LAB_00115f8c;
              rdlength = *(ushort *)(puVar8 + (int)(uVar23 + 8)) << 8 |
                         *(ushort *)(puVar8 + (int)(uVar23 + 8)) >> 8;
              sVar25 = (size_t)(uVar17 + rdlength);
              DVar7 = DOH_DNS_OUT_OF_RANGE;
              if (sVar9 < sVar25) goto LAB_00115f91;
              DVar7 = rdata(puVar8,sVar9,rdlength,type,uVar17,&local_2a0);
              if (DVar7 != DOH_OK) {
                *pDVar21 = DVar7;
                Curl_dyn_free(s);
                pcVar10 = "bad error code";
                if (DVar7 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) goto LAB_00115f9d;
                goto LAB_00115fad;
              }
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
            bVar30 = type != 2;
          }
          local_328[0] = (uint)sVar25;
          uVar15 = local_328[0];
          for (uVar6 = *(ushort *)(puVar8 + 8) << 8 | *(ushort *)(puVar8 + 8) >> 8; uVar6 != 0;
              uVar6 = uVar6 - 1) {
            do {
              uVar15 = (int)sVar25 + 1;
              if (sVar9 < uVar15) goto LAB_00115f8c;
              bVar1 = puVar8[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar7 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00115f91;
                uVar15 = (int)sVar25 + 2;
                if (sVar9 < uVar15) goto LAB_00115f8c;
                break;
              }
              uVar15 = uVar15 + bVar1;
              if (sVar9 < uVar15) goto LAB_00115f8c;
              sVar25 = (size_t)uVar15;
            } while (bVar1 != 0);
            if ((sVar9 < uVar15 + 8) || (sVar9 < uVar15 + 10)) goto LAB_00115f8c;
            uVar15 = (uint)(ushort)(*(ushort *)(puVar8 + (int)(uVar15 + 8)) << 8 |
                                   *(ushort *)(puVar8 + (int)(uVar15 + 8)) >> 8) + uVar15 + 10;
            sVar25 = (size_t)uVar15;
            DVar7 = DOH_DNS_OUT_OF_RANGE;
            if (sVar9 < sVar25) goto LAB_00115f91;
          }
          local_328[0] = uVar15;
          for (uVar6 = *(ushort *)(puVar8 + 10) << 8 | *(ushort *)(puVar8 + 10) >> 8; uVar6 != 0;
              uVar6 = uVar6 - 1) {
            DVar7 = skipqname(puVar8,sVar9,local_328);
            if (DVar7 != DOH_OK) goto LAB_00115f91;
            DVar7 = DOH_DNS_OUT_OF_RANGE;
            if ((sVar9 < local_328[0] + 8) || (sVar9 < local_328[0] + 10)) goto LAB_00115f91;
            uVar15 = (uint)(ushort)(*(ushort *)(puVar8 + (int)(local_328[0] + 8)) << 8 |
                                   *(ushort *)(puVar8 + (int)(local_328[0] + 8)) >> 8) +
                     local_328[0] + 10;
            sVar25 = (size_t)uVar15;
            if (sVar9 < sVar25) goto LAB_00115f91;
            local_328[0] = uVar15;
          }
          DVar7 = DOH_DNS_MALFORMAT;
          if ((sVar9 == sVar25) &&
             ((!(bool)(bVar30 & local_2a0.numcname == 0) ||
              (DVar7 = DOH_NO_CONTENT, local_2a0.numaddr != 0)))) {
            *pDVar21 = DOH_OK;
            Curl_dyn_free(s);
            data = local_338;
            goto LAB_00115fec;
          }
        }
        goto LAB_00115f91;
      }
      goto LAB_00115fec;
    }
  }
  return CVar19;
LAB_00115f8c:
  DVar7 = DOH_DNS_OUT_OF_RANGE;
LAB_00115f91:
  *pDVar21 = DVar7;
  Curl_dyn_free(s);
LAB_00115f9d:
  pcVar10 = errors_rel + *(int *)(errors_rel + (ulong)DVar7 * 4);
LAB_00115fad:
  data = local_338;
  pcVar16 = "AAAA";
  if (datap[lVar24].dnstype == 1) {
    pcVar16 = "A";
  }
  Curl_infof(local_338,"DOH: %s type %s for %s",pcVar10,pcVar16,local_340->host);
LAB_00115fec:
  lVar24 = 1;
  pDVar21 = &local_344;
  bVar30 = !bVar26;
  bVar26 = false;
  if (bVar30) goto LAB_001160a5;
  goto LAB_00115bfa;
LAB_001160a5:
  CVar19 = CURLE_COULDNT_RESOLVE_HOST;
  if ((local_348 == DOH_OK) || (local_344 == DOH_OK)) {
    Curl_infof(data,"DOH Host name: %s",local_340->host);
    Curl_infof(data,"TTL: %u seconds",(ulong)local_2a0.ttl);
    if (0 < local_2a0.numaddr) {
      puVar8 = local_2a0.addr[0].ip.v4 + 1;
      lVar24 = 0;
      do {
        iVar2 = local_2a0.addr[lVar24].type;
        if (iVar2 == 0x1c) {
          curl_msnprintf((char *)local_328,0x80,"DOH AAAA: ");
          sVar9 = 0x76;
          uVar28 = 0xfffffffffffffffe;
          pcVar10 = local_31e;
          do {
            pcVar16 = ":";
            if (uVar28 == 0xfffffffffffffffe) {
              pcVar16 = "";
            }
            curl_msnprintf(pcVar10,sVar9,"%s%02x%02x",pcVar16,(ulong)puVar8[uVar28 + 1],
                           (ulong)puVar8[uVar28 + 2]);
            sVar11 = strlen(pcVar10);
            data = local_338;
            sVar9 = sVar9 - sVar11;
            pcVar10 = pcVar10 + sVar11;
            uVar28 = uVar28 + 2;
          } while (uVar28 < 0xe);
          Curl_infof(local_338,"%s",local_328);
        }
        else if (iVar2 == 1) {
          Curl_infof(data,"DOH A: %u.%u.%u.%u",(ulong)local_2a0.addr[lVar24].ip.v4[0],
                     (ulong)local_2a0.addr[lVar24].ip.v4[1],(ulong)local_2a0.addr[lVar24].ip.v4[2],
                     (ulong)local_2a0.addr[lVar24].ip.v4[3]);
        }
        lVar24 = lVar24 + 1;
        puVar8 = puVar8 + 0x14;
      } while (lVar24 < local_2a0.numaddr);
    }
    if (0 < local_2a0.numcname) {
      pdVar18 = &local_2a0;
      lVar24 = 0;
      do {
        pcVar10 = Curl_dyn_ptr(pdVar18->cname);
        Curl_infof(data,"CNAME: %s",pcVar10);
        lVar24 = lVar24 + 1;
        pdVar18 = (dohentry *)(pdVar18->cname + 1);
      } while (lVar24 < local_2a0.numcname);
    }
    iVar27 = local_2a0.numcname;
    iVar2 = local_2a0.numaddr;
    pdVar3 = local_340;
    pcVar10 = local_340->host;
    sVar11 = strlen(pcVar10);
    if (iVar2 < 1) {
LAB_001164c9:
      if (iVar27 < 1) {
        return CURLE_OUT_OF_MEMORY;
      }
      lVar24 = 0;
      pdVar18 = &local_2a0;
      do {
        Curl_dyn_free(pdVar18->cname);
        lVar24 = lVar24 + 1;
        pdVar18 = (dohentry *)(pdVar18->cname + 1);
      } while (lVar24 < local_2a0.numcname);
      return CURLE_OUT_OF_MEMORY;
    }
    uVar6 = (ushort)pdVar3->port;
    paVar22 = &local_2a0.addr[0].ip;
    lVar24 = 0;
    local_370 = (Curl_addrinfo *)0x0;
    pCVar29 = (Curl_addrinfo *)0x0;
    do {
      iVar2 = ((dohaddr *)((long)paVar22 + -4))->type;
      lVar20 = 0x1c;
      if (iVar2 != 0x1c) {
        lVar20 = 0x10;
      }
      pCVar12 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar11 + 0x31 + lVar20);
      if (pCVar12 == (Curl_addrinfo *)0x0) {
        Curl_freeaddrinfo(local_370);
        iVar27 = local_2a0.numcname;
        goto LAB_001164c9;
      }
      pCVar12->ai_addr = (sockaddr *)(pCVar12 + 1);
      pcVar16 = (char *)((long)&pCVar12[1].ai_flags + lVar20);
      pCVar12->ai_canonname = pcVar16;
      memcpy(pcVar16,pcVar10,sVar11 + 1);
      data = local_338;
      if (local_370 == (Curl_addrinfo *)0x0) {
        local_370 = pCVar12;
      }
      if (pCVar29 != (Curl_addrinfo *)0x0) {
        pCVar29->ai_next = pCVar12;
      }
      pCVar12->ai_family = (uint)(iVar2 == 0x1c) * 8 + 2;
      pCVar12->ai_socktype = 1;
      pCVar12->ai_addrlen = (curl_socklen_t)lVar20;
      psVar4 = pCVar12->ai_addr;
      if (iVar2 == 0x1c) {
        uVar5 = *(undefined8 *)((long)paVar22 + 8);
        *(undefined8 *)(psVar4->sa_data + 6) = *(undefined8 *)paVar22;
        psVar4[1].sa_family = (short)uVar5;
        psVar4[1].sa_data[0] = (char)((ulong)uVar5 >> 0x10);
        psVar4[1].sa_data[1] = (char)((ulong)uVar5 >> 0x18);
        psVar4[1].sa_data[2] = (char)((ulong)uVar5 >> 0x20);
        psVar4[1].sa_data[3] = (char)((ulong)uVar5 >> 0x28);
        psVar4[1].sa_data[4] = (char)((ulong)uVar5 >> 0x30);
        psVar4[1].sa_data[5] = (char)((ulong)uVar5 >> 0x38);
        sVar14 = 10;
      }
      else {
        *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)paVar22;
        sVar14 = 2;
      }
      psVar4->sa_family = sVar14;
      *(ushort *)psVar4->sa_data = uVar6 << 8 | uVar6 >> 8;
      lVar24 = lVar24 + 1;
      paVar22 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar22 + 0x14);
      pCVar29 = pCVar12;
    } while (lVar24 < local_2a0.numaddr);
    if (local_338->share != (Curl_share *)0x0) {
      Curl_share_lock(local_338,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar13 = Curl_cache_addr(data,local_370,local_340->host,local_340->port);
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar13 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(local_370);
    }
    else {
      (data->state).async.dns = pCVar13;
      *local_330 = pCVar13;
      CVar19 = CURLE_OK;
    }
  }
  if (0 < local_2a0.numcname) {
    pdVar18 = &local_2a0;
    lVar24 = 0;
    do {
      Curl_dyn_free(pdVar18->cname);
      lVar24 = lVar24 + 1;
      pdVar18 = (dohentry *)(pdVar18->cname + 1);
    } while (lVar24 < local_2a0.numcname);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return CVar19;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DOH-resolve: %s", data->state.async.hostname);
    return data->conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DOH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DOH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DOH transactions to complete */
  return CURLE_OK;
}